

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O3

fio_str_info_s * fiobj_obj2cstr(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  double num;
  byte bVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  fio_str_info_s *pfVar7;
  char *pcVar8;
  uint uVar9;
  char cVar10;
  ulong uVar11;
  long *in_FS_OFFSET;
  undefined4 uVar12;
  stat sStack_a8;
  
  if (o == 0) {
LAB_0014787f:
    pcVar8 = anon_var_dwarf_20c;
    __return_storage_ptr__->data = anon_var_dwarf_20c;
    uVar12 = 4;
LAB_00147891:
    *(undefined4 *)&__return_storage_ptr__->capa = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->capa + 4) = 0;
    *(undefined4 *)&__return_storage_ptr__->len = uVar12;
    *(undefined4 *)((long)&__return_storage_ptr__->len + 4) = 0;
    return (fio_str_info_s *)pcVar8;
  }
  cVar10 = (char)o;
  if ((o & 1) != 0) {
    pfVar7 = fio_ltocstr(__return_storage_ptr__,(long)o >> 1);
    return pfVar7;
  }
  switch((uint)o & 6) {
  case 0:
    cVar10 = *(char *)(o & 0xfffffffffffffff8);
    break;
  case 2:
    goto fio_str2str;
  case 4:
    goto switchD_00147819_caseD_4;
  case 6:
    if (cVar10 == '&') {
      pcVar8 = anon_var_dwarf_217;
      __return_storage_ptr__->data = anon_var_dwarf_217;
      uVar12 = 5;
      goto LAB_00147891;
    }
    uVar9 = (uint)o & 0xff;
    if (uVar9 == 0x16) {
      pcVar8 = anon_var_dwarf_222;
      __return_storage_ptr__->data = anon_var_dwarf_222;
      uVar12 = 4;
      goto LAB_00147891;
    }
    if (uVar9 == 6) goto LAB_0014787f;
  }
  switch(cVar10) {
  case '\'':
    num = *(double *)((o & 0xfffffffffffffff8) + 8);
    if (NAN(num)) {
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = 3;
      pcVar8 = "NaN";
    }
    else {
      if (ABS(num) != INFINITY) {
        __return_storage_ptr__->capa = 0;
        lVar2 = *in_FS_OFFSET;
        sStack_a8.__unused[2] = 0x143b2a;
        sVar6 = fio_ftoa((char *)(lVar2 + -0x260),num,'\n');
        __return_storage_ptr__->len = sVar6;
        __return_storage_ptr__->data = (char *)(lVar2 + -0x260);
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->capa = 0;
      if (num <= 0.0) {
        __return_storage_ptr__->len = 9;
        pcVar8 = "-Infinity";
      }
      else {
        __return_storage_ptr__->len = 8;
        pcVar8 = "Infinity";
      }
    }
    __return_storage_ptr__->data = pcVar8;
    return __return_storage_ptr__;
  case '(':
fio_str2str:
    uVar11 = o & 0xfffffffffffffff8;
    bVar1 = *(byte *)(uVar11 + 0x10);
    if ((bVar1 == 0) && (pcVar8 = *(char **)(uVar11 + 0x38), pcVar8 != (char *)0x0)) {
      if (*(char *)(uVar11 + 0x11) == '\0') {
        sVar6 = *(size_t *)(uVar11 + 0x20);
      }
      else {
        sVar6 = 0;
      }
      __return_storage_ptr__->capa = sVar6;
      __return_storage_ptr__->len = *(size_t *)(uVar11 + 0x28);
      __return_storage_ptr__->data = pcVar8;
      return __return_storage_ptr__;
    }
    sVar6 = 0x2d;
    if (*(char *)(uVar11 + 0x11) != '\0') {
      sVar6 = 0;
    }
    __return_storage_ptr__->capa = sVar6;
    __return_storage_ptr__->len = (ulong)(bVar1 >> 1);
    __return_storage_ptr__->data = (char *)(uVar11 + 0x12);
    return __return_storage_ptr__;
  case ')':
    break;
  case '*':
switchD_00147819_caseD_4:
    break;
  case '+':
    if (*(int *)(o + 0x30) == -2) {
      fiobj_data_pread(__return_storage_ptr__,*(FIOBJ *)(o + 0x10),*(intptr_t *)(o + 0x18),
                       *(uintptr_t *)(o + 0x20));
    }
    else {
      if (*(int *)(o + 0x30) != -1) {
        do {
          iVar3 = fstat(*(int *)(o + 0x30),&sStack_a8);
          if (iVar3 == 0) {
            if (0 < sStack_a8.st_size) {
              *(undefined8 *)(o + 0x20) = 0;
              *(undefined8 *)(o + 0x28) = 0;
              fiobj_data_pre_write(o,sStack_a8.st_size + 1);
              sVar5 = pread(*(int *)(o + 0x30),*(void **)(o + 8),sStack_a8.st_size,0);
              if (sVar5 != sStack_a8.st_size) {
                __return_storage_ptr__->capa = 0;
                __return_storage_ptr__->len = 0;
                __return_storage_ptr__->data = (char *)0x0;
                return __return_storage_ptr__;
              }
              *(undefined1 *)(*(long *)(o + 8) + sStack_a8.st_size) = 0;
              __return_storage_ptr__->capa = 0;
              __return_storage_ptr__->len = sStack_a8.st_size;
              goto LAB_00140a01;
            }
            break;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
      }
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = *(size_t *)(o + 0x20);
LAB_00140a01:
      __return_storage_ptr__->data = *(char **)(o + 8);
    }
    return __return_storage_ptr__;
  default:
    __return_storage_ptr__->capa = 0;
    lVar2 = *in_FS_OFFSET;
    sStack_a8.__unused[2] = 0x143a57;
    sVar6 = fio_ltoa((char *)(lVar2 + -0x260),*(int64_t *)((o & 0xfffffffffffffff8) + 8),'\n');
    __return_storage_ptr__->len = sVar6;
    __return_storage_ptr__->data = (char *)(lVar2 + -0x260);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->capa = 0;
  __return_storage_ptr__->len = 0;
  __return_storage_ptr__->data = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

FIO_INLINE fio_str_info_s fiobj_obj2cstr(const FIOBJ o) {
  if (!o) {
    fio_str_info_s ret = {0, 4, (char *)"null"};
    return ret;
  }
  if (o & FIOBJECT_NUMBER_FLAG)
    return fio_ltocstr(((intptr_t)o) >> 1);
  if ((o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_PRIMITIVE_FLAG) {
    switch ((fiobj_type_enum)o) {
    case FIOBJ_T_NULL: {
      fio_str_info_s ret = {0, 4, (char *)"null"};
      return ret;
    }
    case FIOBJ_T_FALSE: {
      fio_str_info_s ret = {0, 5, (char *)"false"};
      return ret;
    }
    case FIOBJ_T_TRUE: {
      fio_str_info_s ret = {0, 4, (char *)"true"};
      return ret;
    }
    default:
      break;
    }
  }
  return FIOBJECT2VTBL(o)->to_str(o);
}